

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void EncodeContextMap(MemoryManager *m,EncodeContextMapArena *arena,uint32_t *context_map,
                     size_t context_map_size,size_t num_clusters,HuffmanTree *tree,
                     size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong *puVar4;
  size_t in_RCX;
  uint16_t *in_RSI;
  long in_R8;
  uint32_t *in_R9;
  size_t *in_stack_00000008;
  MemoryManager *in_stack_00000010;
  uint32_t extra_bits_val;
  uint32_t rle_symbol;
  int use_rle;
  uint16_t *bits;
  uint8_t *depths;
  uint32_t *histogram;
  size_t num_rle_symbols;
  uint32_t max_run_length_prefix;
  uint32_t *rle_symbols;
  size_t i;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  size_t in_stack_fffffffffffffe28;
  size_t *p_00;
  MemoryManager *in_stack_fffffffffffffe30;
  MemoryManager *m_00;
  uint32_t *local_1c0;
  uint16_t *bits_00;
  uint8_t *depth;
  undefined4 in_stack_fffffffffffffe78;
  uint uVar5;
  uint8_t *puVar6;
  size_t *in_stack_ffffffffffffff20;
  uint8_t *in_stack_ffffffffffffff28;
  uint32_t *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  uint32_t *in_stack_ffffffffffffff60;
  
  uVar5 = 6;
  depth = (uint8_t *)0x0;
  bits_00 = in_RSI;
  StoreVarLenUint8(in_R8 - 1,in_stack_00000008,(uint8_t *)in_stack_00000010);
  if (in_R8 != 1) {
    if (in_RCX == 0) {
      local_1c0 = (uint32_t *)0x0;
    }
    else {
      local_1c0 = (uint32_t *)
                  duckdb_brotli::BrotliAllocate(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)
      ;
    }
    MoveToFrontTransform
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    RunLengthCodeZeros(in_RCX,local_1c0,(size_t *)&stack0xfffffffffffffe70,
                       (uint32_t *)&stack0xfffffffffffffe7c);
    memset(bits_00,0,0x440);
    for (puVar6 = (uint8_t *)0x0; puVar6 < depth; puVar6 = puVar6 + 1) {
      *(int *)(bits_00 + (ulong)(local_1c0[(long)puVar6] & 0x1ff) * 2) =
           *(int *)(bits_00 + (ulong)(local_1c0[(long)puVar6] & 0x1ff) * 2) + 1;
    }
    puVar4 = (ulong *)((long)&in_stack_00000010->alloc_func + (*in_stack_00000008 >> 3));
    *puVar4 = (long)(int)(uint)(uVar5 != 0) << ((byte)*in_stack_00000008 & 7) | (ulong)(byte)*puVar4
    ;
    *in_stack_00000008 = *in_stack_00000008 + 1;
    if ((uVar5 != 0) != 0) {
      puVar4 = (ulong *)((long)&in_stack_00000010->alloc_func + (*in_stack_00000008 >> 3));
      *puVar4 = (ulong)(uVar5 - 1) << ((byte)*in_stack_00000008 & 7) | (ulong)(byte)*puVar4;
      *in_stack_00000008 = *in_stack_00000008 + 4;
    }
    p_00 = in_stack_00000008;
    m_00 = in_stack_00000010;
    BuildAndStoreHuffmanTree
              (in_R9,(size_t)puVar6,(size_t)local_1c0,
               (HuffmanTree *)CONCAT44(uVar5,in_stack_fffffffffffffe78),depth,bits_00,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    for (puVar6 = (uint8_t *)0x0; puVar6 < depth; puVar6 = puVar6 + 1) {
      uVar3 = local_1c0[(long)puVar6] & 0x1ff;
      uVar2 = local_1c0[(long)puVar6];
      bVar1 = *(byte *)((long)in_RSI + (ulong)uVar3 + 0x440);
      puVar4 = (ulong *)((long)&in_stack_00000010->alloc_func + (*in_stack_00000008 >> 3));
      *puVar4 = (ulong)in_RSI[(ulong)uVar3 + 0x2a8] << ((byte)*in_stack_00000008 & 7) |
                (ulong)(byte)*puVar4;
      *in_stack_00000008 = (ulong)bVar1 + *in_stack_00000008;
      if ((uVar3 != 0) && (uVar3 <= uVar5)) {
        puVar4 = (ulong *)((long)&in_stack_00000010->alloc_func + (*in_stack_00000008 >> 3));
        *puVar4 = (ulong)(uVar2 >> 9) << ((byte)*in_stack_00000008 & 7) | (ulong)(byte)*puVar4;
        *in_stack_00000008 = (ulong)uVar3 + *in_stack_00000008;
      }
    }
    puVar4 = (ulong *)((long)&in_stack_00000010->alloc_func + (*in_stack_00000008 >> 3));
    *puVar4 = 1L << ((byte)*in_stack_00000008 & 7) | (ulong)(byte)*puVar4;
    *in_stack_00000008 = *in_stack_00000008 + 1;
    duckdb_brotli::BrotliFree(m_00,p_00);
  }
  return;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             EncodeContextMapArena* arena,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t* BROTLI_RESTRICT const histogram = arena->histogram;
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t* BROTLI_RESTRICT const depths = arena->depths;
  uint16_t* BROTLI_RESTRICT const bits = arena->bits;

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(rle_symbols)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(arena->histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}